

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.cpp
# Opt level: O1

void __thiscall Rml::Event::Event(Event *this)

{
  (this->super_ScriptInterface).super_Releasable._vptr_Releasable =
       (_func_int **)&PTR__Event_00335cb0;
  (this->parameters).m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->parameters).m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parameters).m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->target_element = (Element *)0x0;
  this->current_element = (Element *)0x0;
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  (this->type)._M_string_length = 0;
  (this->type).field_2._M_local_buf[0] = '\0';
  (this->mouse_screen_position).x = 0.0;
  (this->mouse_screen_position).y = 0.0;
  this->phase = None;
  this->instancer = (EventInstancer *)0x0;
  this->id = Invalid;
  this->interruptible = false;
  this->interrupted = false;
  this->interrupted_immediate = false;
  this->has_mouse_position = false;
  return;
}

Assistant:

Event::Event() {}